

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<glcts::(anonymous_namespace)::Basic_UBO_SSBO_LayoutCase2VS>(void)

{
  Basic_UBO_SSBO_LayoutCase2VS *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (Basic_UBO_SSBO_LayoutCase2VS *)operator_new(0x40);
  (this->super_BasicStdLayoutBase3VS).m_buffer[1] = 0;
  (this->super_BasicStdLayoutBase3VS).m_buffer[2] = 0;
  *(undefined8 *)((this->super_BasicStdLayoutBase3VS).m_buffer + 3) = 0;
  (this->super_BasicStdLayoutBase3VS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.m_context = (Context *)0x0;
  (this->super_BasicStdLayoutBase3VS).m_program = 0;
  (this->super_BasicStdLayoutBase3VS).m_buffer[0] = 0;
  (this->super_BasicStdLayoutBase3VS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_BasicStdLayoutBase3VS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
    super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_BasicStdLayoutBase3VS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_BasicStdLayoutBase3VS).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  glcts::anon_unknown_0::Basic_UBO_SSBO_LayoutCase2VS::Basic_UBO_SSBO_LayoutCase2VS(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}